

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::
ItemSimilarityRecommender_SimilarItems
          (ItemSimilarityRecommender_SimilarItems *this,ItemSimilarityRecommender_SimilarItems *from
          )

{
  ulong uVar1;
  double dVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_SimilarItems_004bdfa0;
  (this->similaritemlist_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->similaritemlist_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->similaritemlist_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->similaritemlist_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::TypeHandler>
            (&(this->similaritemlist_).super_RepeatedPtrFieldBase,
             &(from->similaritemlist_).super_RepeatedPtrFieldBase);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  dVar2 = from->itemscoreadjustment_;
  this->itemid_ = from->itemid_;
  this->itemscoreadjustment_ = dVar2;
  return;
}

Assistant:

ItemSimilarityRecommender_SimilarItems::ItemSimilarityRecommender_SimilarItems(const ItemSimilarityRecommender_SimilarItems& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      similaritemlist_(from.similaritemlist_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&itemid_, &from.itemid_,
    static_cast<size_t>(reinterpret_cast<char*>(&itemscoreadjustment_) -
    reinterpret_cast<char*>(&itemid_)) + sizeof(itemscoreadjustment_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
}